

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::SwapObjects(NULLCRef l,NULLCRef r)

{
  uint size_00;
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  char *pcVar3;
  FastVector<char,_false,_false> *pFVar4;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_0000001c;
  char **local_250;
  char *tmp;
  char tmpStack [512];
  uint size;
  
  if (in_stack_00000008 == l.ptr._4_4_) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    size_00 = pEVar1->size;
    if (size_00 < 0x200) {
      local_250 = &tmp;
    }
    else {
      local_250 = (char **)AllocObject(size_00,in_stack_00000008);
    }
    memcpy(local_250,(void *)CONCAT84(l._0_8_,in_stack_0000000c),(ulong)size_00);
    memcpy((void *)CONCAT84(l._0_8_,in_stack_0000000c),(void *)CONCAT44(r.typeID,in_stack_0000001c),
           (ulong)size_00);
    memcpy((void *)CONCAT44(r.typeID,in_stack_0000001c),local_250,(ulong)size_00);
  }
  else {
    pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),l.ptr._4_4_);
    pcVar2 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
    pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    pcVar3 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
    nullcThrowError("ERROR: types don\'t match (%s ref, %s ref)",pcVar2,pcVar3);
  }
  return;
}

Assistant:

void NULLC::SwapObjects(NULLCRef l, NULLCRef r)
{
	if(l.typeID != r.typeID)
	{
		nullcThrowError("ERROR: types don't match (%s ref, %s ref)", &linker->exSymbols[linker->exTypes[r.typeID].offsetToName], &linker->exSymbols[linker->exTypes[l.typeID].offsetToName]);
		return;
	}
	unsigned size = linker->exTypes[l.typeID].size;

	char tmpStack[512];
	// $$ should use some extendable static storage for big objects
	char *tmp = size < 512 ? tmpStack : (char*)NULLC::AllocObject(size, l.typeID);
	memcpy(tmp, l.ptr, size);
	memcpy(l.ptr, r.ptr, size);
	memcpy(r.ptr, tmp, size);
}